

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_boolean
          (xpath_ast_node *this,xpath_context *c,xpath_stack *stack)

{
  byte bVar1;
  char cVar2;
  char_t cVar3;
  char_t cVar4;
  bool bVar5;
  xpath_value_type xVar6;
  char_t *pcVar7;
  unspecified_bool_type p_Var8;
  unspecified_bool_type p_Var9;
  char_t *pcVar10;
  double value_00;
  bool local_261;
  anon_union_8_5_7bd254c6_for__data local_260;
  bool local_249;
  bool local_1f2;
  bool local_1f1;
  xpath_node_set_raw local_1e0;
  undefined1 local_1c0 [8];
  xpath_allocator_capture cr_4;
  undefined1 local_188 [8];
  xpath_allocator_capture cr_3;
  xml_attribute local_160;
  xml_attribute attr;
  char_t *value_1;
  char_t *local_140;
  char_t *lit;
  char_t *value;
  xml_attribute a;
  xml_node n;
  xpath_string lang;
  xpath_allocator_capture cr_2;
  undefined1 local_e0 [8];
  xpath_string rr_1;
  xpath_string lr_1;
  xpath_allocator_capture cr_1;
  xpath_string rr;
  undefined1 local_68 [8];
  xpath_string lr;
  xpath_allocator_capture cr;
  xpath_stack *stack_local;
  xpath_context *c_local;
  xpath_ast_node *this_local;
  
  switch(this->_type) {
  case '\x01':
    bVar5 = eval_boolean(this->_left,c,stack);
    local_1f1 = true;
    if (!bVar5) {
      local_1f1 = eval_boolean(this->_right,c,stack);
    }
    this_local._7_1_ = local_1f1;
    break;
  case '\x02':
    bVar5 = eval_boolean(this->_left,c,stack);
    local_1f2 = false;
    if (bVar5) {
      local_1f2 = eval_boolean(this->_right,c,stack);
    }
    this_local._7_1_ = local_1f2;
    break;
  case '\x03':
    this_local._7_1_ =
         compare_eq<pugi::impl::(anonymous_namespace)::equal_to>
                   (this->_left,this->_right,c,stack,(equal_to *)((long)&cr._state._error + 7));
    break;
  case '\x04':
    this_local._7_1_ =
         compare_eq<pugi::impl::(anonymous_namespace)::not_equal_to>
                   (this->_left,this->_right,c,stack,(not_equal_to *)((long)&cr._state._error + 6));
    break;
  case '\x05':
    this_local._7_1_ =
         compare_rel<pugi::impl::(anonymous_namespace)::less>
                   (this->_left,this->_right,c,stack,(less *)((long)&cr._state._error + 5));
    break;
  case '\x06':
    this_local._7_1_ =
         compare_rel<pugi::impl::(anonymous_namespace)::less>
                   (this->_right,this->_left,c,stack,(less *)((long)&cr._state._error + 4));
    break;
  case '\a':
    this_local._7_1_ =
         compare_rel<pugi::impl::(anonymous_namespace)::less_equal>
                   (this->_left,this->_right,c,stack,(less_equal *)((long)&cr._state._error + 3));
    break;
  case '\b':
    this_local._7_1_ =
         compare_rel<pugi::impl::(anonymous_namespace)::less_equal>
                   (this->_right,this->_left,c,stack,(less_equal *)((long)&cr._state._error + 2));
    break;
  case '\x14':
    bVar1 = this->_rettype;
    xVar6 = xpath_variable::type((this->_data).variable);
    if (bVar1 != xVar6) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x2898,
                    "bool pugi::impl::(anonymous namespace)::xpath_ast_node::eval_boolean(const xpath_context &, const xpath_stack &)"
                   );
    }
    if (this->_rettype == '\x04') {
      bVar5 = xpath_variable::get_boolean((this->_data).variable);
      return bVar5;
    }
  default:
    cVar2 = this->_rettype;
    if (cVar2 == '\x01') {
      xpath_allocator_capture::xpath_allocator_capture
                ((xpath_allocator_capture *)local_1c0,stack->result);
      eval_node_set(&local_1e0,this,c,stack,nodeset_eval_any);
      bVar5 = xpath_node_set_raw::empty(&local_1e0);
      this_local._7_1_ = (bool)((bVar5 ^ 0xffU) & 1);
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_1c0);
    }
    else if (cVar2 == '\x02') {
      value_00 = eval_number(this,c,stack);
      this_local._7_1_ = convert_number_to_boolean(value_00);
    }
    else {
      if (cVar2 != '\x03') {
        __assert_fail("false && \"Wrong expression for return type boolean\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x28b5,
                      "bool pugi::impl::(anonymous namespace)::xpath_ast_node::eval_boolean(const xpath_context &, const xpath_stack &)"
                     );
      }
      xpath_allocator_capture::xpath_allocator_capture
                ((xpath_allocator_capture *)local_188,stack->result);
      eval_string((xpath_string *)&cr_4._state._error,this,c,stack);
      bVar5 = xpath_string::empty((xpath_string *)&cr_4._state._error);
      this_local._7_1_ = (bool)((bVar5 ^ 0xffU) & 1);
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_188);
    }
    break;
  case '\"':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&lr._length_heap,stack->result);
    eval_string((xpath_string *)local_68,this->_left,c,stack);
    eval_string((xpath_string *)&cr_1._state._error,this->_right,c,stack);
    pcVar10 = xpath_string::c_str((xpath_string *)local_68);
    pcVar7 = xpath_string::c_str((xpath_string *)&cr_1._state._error);
    this_local._7_1_ = starts_with(pcVar10,pcVar7);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&lr._length_heap);
    break;
  case '#':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&lr_1._length_heap,stack->result);
    eval_string((xpath_string *)&rr_1._length_heap,this->_left,c,stack);
    eval_string((xpath_string *)local_e0,this->_right,c,stack);
    pcVar10 = xpath_string::c_str((xpath_string *)&rr_1._length_heap);
    pcVar7 = xpath_string::c_str((xpath_string *)local_e0);
    pcVar10 = find_substring(pcVar10,pcVar7);
    this_local._7_1_ = pcVar10 != (char_t *)0x0;
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&lr_1._length_heap)
    ;
    break;
  case '-':
    this_local._7_1_ = eval_boolean(this->_left,c,stack);
    break;
  case '.':
    bVar5 = eval_boolean(this->_left,c,stack);
    this_local._7_1_ = (bool)((bVar5 ^ 0xffU) & 1);
    break;
  case '/':
    this_local._7_1_ = true;
    break;
  case '0':
    this_local._7_1_ = false;
    break;
  case '1':
    cr_2._state._error = (bool *)xpath_node::attribute(&c->n);
    p_Var9 = xml_attribute::operator_cast_to_function_pointer((xml_attribute *)&cr_2._state._error);
    if (p_Var9 != (unspecified_bool_type)0x0) {
      return false;
    }
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&lang._length_heap,stack->result);
    eval_string((xpath_string *)&n,this->_left,c,stack);
    a._attr = (xml_attribute_struct *)xpath_node::node(&c->n);
    while (p_Var8 = xml_node::operator_cast_to_function_pointer((xml_node *)&a),
          p_Var8 != (unspecified_bool_type)0x0) {
      value = (char_t *)xml_node::attribute((xml_node *)&a,(char_t *)"xml:lang");
      p_Var9 = xml_attribute::operator_cast_to_function_pointer((xml_attribute *)&value);
      if (p_Var9 != (unspecified_bool_type)0x0) {
        lit = xml_attribute::value((xml_attribute *)&value);
        local_140 = xpath_string::c_str((xpath_string *)&n);
        goto LAB_0010effb;
      }
      a._attr = (xml_attribute_struct *)xml_node::parent((xml_node *)&a);
    }
    this_local._7_1_ = false;
    goto LAB_0010f13e;
  case ';':
    if (this->_right->_type == '\x12') {
      local_260 = this->_right->_data;
    }
    else {
      local_260.string = xpath_variable::get_string((this->_right->_data).variable);
    }
    attr._attr = (xml_attribute_struct *)local_260;
    cr_3._state._error = (bool *)xpath_node::node(&c->n);
    local_160 = xml_node::attribute((xml_node *)&cr_3._state._error,(this->_left->_data).string);
    p_Var9 = xml_attribute::operator_cast_to_function_pointer(&local_160);
    local_261 = false;
    if (p_Var9 != (unspecified_bool_type)0x0) {
      pcVar10 = xml_attribute::value(&local_160);
      bVar5 = strequal(pcVar10,(char_t *)attr._attr);
      local_261 = false;
      if (bVar5) {
        pcVar10 = xml_attribute::name(&local_160);
        local_261 = is_xpath_attribute(pcVar10);
      }
    }
    this_local._7_1_ = local_261;
  }
  return this_local._7_1_;
LAB_0010effb:
  if (*local_140 == '\0') goto LAB_0010f0b4;
  cVar3 = tolower_ascii(*local_140);
  cVar4 = tolower_ascii(*lit);
  if (cVar3 != cVar4) {
    this_local._7_1_ = false;
    goto LAB_0010f13e;
  }
  lit = lit + 1;
  local_140 = local_140 + 1;
  goto LAB_0010effb;
LAB_0010f0b4:
  local_249 = true;
  if (*lit != '\0') {
    local_249 = *lit == '-';
  }
  this_local._7_1_ = local_249;
LAB_0010f13e:
  xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&lang._length_heap);
  return this_local._7_1_;
}

Assistant:

bool eval_boolean(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_op_or:
				return _left->eval_boolean(c, stack) || _right->eval_boolean(c, stack);

			case ast_op_and:
				return _left->eval_boolean(c, stack) && _right->eval_boolean(c, stack);

			case ast_op_equal:
				return compare_eq(_left, _right, c, stack, equal_to());

			case ast_op_not_equal:
				return compare_eq(_left, _right, c, stack, not_equal_to());

			case ast_op_less:
				return compare_rel(_left, _right, c, stack, less());

			case ast_op_greater:
				return compare_rel(_right, _left, c, stack, less());

			case ast_op_less_or_equal:
				return compare_rel(_left, _right, c, stack, less_equal());

			case ast_op_greater_or_equal:
				return compare_rel(_right, _left, c, stack, less_equal());

			case ast_func_starts_with:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return starts_with(lr.c_str(), rr.c_str());
			}

			case ast_func_contains:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return find_substring(lr.c_str(), rr.c_str()) != 0;
			}

			case ast_func_boolean:
				return _left->eval_boolean(c, stack);

			case ast_func_not:
				return !_left->eval_boolean(c, stack);

			case ast_func_true:
				return true;

			case ast_func_false:
				return false;

			case ast_func_lang:
			{
				if (c.n.attribute()) return false;

				xpath_allocator_capture cr(stack.result);

				xpath_string lang = _left->eval_string(c, stack);

				for (xml_node n = c.n.node(); n; n = n.parent())
				{
					xml_attribute a = n.attribute(PUGIXML_TEXT("xml:lang"));

					if (a)
					{
						const char_t* value = a.value();

						// strnicmp / strncasecmp is not portable
						for (const char_t* lit = lang.c_str(); *lit; ++lit)
						{
							if (tolower_ascii(*lit) != tolower_ascii(*value)) return false;
							++value;
						}

						return *value == 0 || *value == '-';
					}
				}

				return false;
			}

			case ast_opt_compare_attribute:
			{
				const char_t* value = (_right->_type == ast_string_constant) ? _right->_data.string : _right->_data.variable->get_string();

				xml_attribute attr = c.n.node().attribute(_left->_data.nodetest);

				return attr && strequal(attr.value(), value) && is_xpath_attribute(attr.name());
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_boolean)
					return _data.variable->get_boolean();
			}

			// fallthrough
			default:
			{
				switch (_rettype)
				{
				case xpath_type_number:
					return convert_number_to_boolean(eval_number(c, stack));

				case xpath_type_string:
				{
					xpath_allocator_capture cr(stack.result);

					return !eval_string(c, stack).empty();
				}

				case xpath_type_node_set:
				{
					xpath_allocator_capture cr(stack.result);

					return !eval_node_set(c, stack, nodeset_eval_any).empty();
				}

				default:
					assert(false && "Wrong expression for return type boolean"); // unreachable
					return false;
				}
			}
			}
		}